

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

TestCase * TestCharReaderTestparseWithNoErrors::factory(void)

{
  TestCase *pTVar1;
  TestCharReaderTestparseWithNoErrors *in_stack_fffffffffffffff0;
  
  pTVar1 = (TestCase *)operator_new(0x10);
  pTVar1->_vptr_TestCase = (_func_int **)0x0;
  pTVar1->result_ = (TestResult *)0x0;
  TestCharReaderTestparseWithNoErrors(in_stack_fffffffffffffff0);
  return pTVar1;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithNoErrors) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] = "{ \"property\" : \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs.size() == 0);
  delete reader;
}